

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::RemoveAt(BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,int i,int last,uint targetBucket)

{
  int iVar1;
  DictionaryStats *this_00;
  SimpleDictionaryEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_> **ppSVar2;
  int **ppiVar3;
  int local_3c;
  uint targetBucket_local;
  int last_local;
  int i_local;
  BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  if (last < 0) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SimpleDictionaryEntry__
                        ((WriteBarrierPtr *)&this->entries);
    iVar1 = (*ppSVar2)[i].
            super_DefaultHashedEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>.
            super_ValueEntry<Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>_>
            .
            super_KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>
            .next;
    ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
    (*ppiVar3)[targetBucket] = iVar1;
  }
  else {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SimpleDictionaryEntry__
                        ((WriteBarrierPtr *)&this->entries);
    iVar1 = (*ppSVar2)[i].
            super_DefaultHashedEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>.
            super_ValueEntry<Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>_>
            .
            super_KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>
            .next;
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SimpleDictionaryEntry__
                        ((WriteBarrierPtr *)&this->entries);
    (*ppSVar2)[last].
    super_DefaultHashedEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    .super_KeyValueEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>.
    super_ValueEntry<Memory::WriteBarrierPtr<SourceContextInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>_>
    .super_KeyValueEntryDataLayout2<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>.next
         = iVar1;
  }
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SimpleDictionaryEntry__
                      ((WriteBarrierPtr *)&this->entries);
  anon_unknown_5::KeyValueEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_>::Clear
            ((KeyValueEntry<unsigned_long,_Memory::WriteBarrierPtr<SourceContextInfo>_> *)
             (*ppSVar2 + i));
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SimpleDictionaryEntry__
                      ((WriteBarrierPtr *)&this->entries);
  if (this->freeCount == 0) {
    local_3c = -1;
  }
  else {
    local_3c = this->freeList;
  }
  SetNextFreeEntryIndex(this,*ppSVar2 + i,local_3c);
  this->freeList = i;
  this->freeCount = this->freeCount + 1;
  if (this->stats != (Type)0x0) {
    this_00 = this->stats;
    ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
    DictionaryStats::Remove(this_00,(*ppiVar3)[targetBucket] == -1);
  }
  return;
}

Assistant:

inline void RemoveAt(const int i, const int last, const uint targetBucket)
        {
            if (last < 0)
            {
                buckets[targetBucket] = entries[i].next;
            }
            else
            {
                entries[last].next = entries[i].next;
            }
            entries[i].Clear();
            SetNextFreeEntryIndex(entries[i], freeCount == 0 ? -1 : freeList);
            freeList = i;
            freeCount++;
#if PROFILE_DICTIONARY
            if (stats)
                stats->Remove(buckets[targetBucket] == -1);
#endif
        }